

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.hpp
# Opt level: O0

void __thiscall
libtest::printer::cprintf<char_const*,unsigned_long>
          (printer *this,ansi_sgr *command,char *args,unsigned_long args_1)

{
  ostream *poVar1;
  unsigned_long __s;
  ansi_sgr local_a8;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  string local_48;
  unsigned_long local_28;
  unsigned_long args_local_1;
  char *args_local;
  ansi_sgr *command_local;
  printer *this_local;
  
  poVar1 = this->os;
  local_28 = args_1;
  args_local_1 = (unsigned_long)args;
  args_local = (char *)command;
  command_local = (ansi_sgr *)this;
  ansi_sgr::to_string_abi_cxx11_(&local_48,command);
  std::operator<<(poVar1,(string *)&local_48);
  __s = args_local_1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,(char *)__s,&local_79);
  printf<unsigned_long>(this,&local_78,local_28);
  poVar1 = this->os;
  ansi_sgr::ansi_sgr(&local_a8,white,reset);
  ansi_sgr::to_string_abi_cxx11_(&local_a0,&local_a8);
  std::operator<<(poVar1,(string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void cprintf(const ansi_sgr& command, Args... args) { os << command.to_string(), printf(args...), os << ansi_sgr{}.to_string(); }